

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtil.cpp
# Opt level: O3

OpLayoutType Js::OpCodeUtil::GetOpCodeLayout(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined6 in_register_0000003a;
  uint uVar4;
  uint32 *puVar5;
  
  uVar4 = (uint)op;
  if ((uint)CONCAT62(in_register_0000003a,op) < 0x100) {
    puVar5 = (uint32 *)(OpCodeLayouts + (ulong)op * 4);
  }
  else if (uVar4 < 0x189) {
    puVar5 = (uint32 *)(ExtendedOpCodeLayouts + (ulong)(uVar4 - 0x100) * 4);
  }
  else {
    if (0x328 < uVar4 - 0x18a) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                  ,0x109,
                                  "(opIndex < (sizeof(*__countof_helper(BackendOpCodeLayouts)) + 0))"
                                  ,"opIndex < (sizeof(*__countof_helper(BackendOpCodeLayouts)) + 0)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    puVar5 = (uint32 *)(BackendOpCodeLayouts + (ulong)(uVar4 - 0x18a) * 4);
  }
  return (OpLayoutType)*puVar5;
}

Assistant:

OpLayoutType OpCodeUtil::GetOpCodeLayout(OpCode op)
    {
        if ((uint)op <= (uint)Js::OpCode::MaxByteSizedOpcodes)
        {
            AnalysisAssert((uint)op < _countof(OpCodeLayouts));
            return OpCodeLayouts[(uint)op];
        }
        else if (op < Js::OpCode::ByteCodeLast)
        {
            uint opIndex = op - (Js::OpCode::MaxByteSizedOpcodes + 1);
            AnalysisAssert(opIndex < _countof(ExtendedOpCodeLayouts));
            return ExtendedOpCodeLayouts[opIndex];
        }
        uint opIndex = op - (Js::OpCode::ByteCodeLast + 1);
        AnalysisAssert(opIndex < _countof(BackendOpCodeLayouts));
        return BackendOpCodeLayouts[opIndex];
    }